

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

bool __thiscall duckdb_shell::ShellState::ImportData(ShellState *this,char **azArg,idx_t nArg)

{
  ShellState *pSVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int c;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  undefined8 uVar9;
  code *pcVar10;
  FILE *out;
  FILE *pFVar11;
  ImportCtx *p;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  sqlite3_stmt *pStmt;
  char zSep [2];
  sqlite3_stmt *local_c8;
  uint local_bc;
  ShellState *local_b8;
  char *local_b0;
  int local_a4;
  ulong local_a0;
  ImportCtx local_98;
  ulong local_48;
  ulong local_40;
  char local_32 [2];
  
  if (safe_mode == '\x01') {
    ImportData();
    return false;
  }
  local_c8 = (sqlite3_stmt *)0x0;
  local_98.cRowSep = 0;
  local_98._68_4_ = 0;
  local_98.nErr = 0;
  local_98.bNotFirst = 0;
  local_98.cTerm = 0;
  local_98.cColSep = 0;
  local_98.n = 0;
  local_98.nAlloc = 0;
  local_98.nLine = 0;
  local_98.nRow = 0;
  local_98.xCloser = (_func_int_FILE_ptr *)0x0;
  local_98.z = (char *)0x0;
  local_98.zFile = (char *)0x0;
  local_98.in = (FILE *)0x0;
  pcVar14 = (char *)0x0;
  if (nArg < 2) {
LAB_0020b429:
    pcVar8 = "FILE TABLE";
    if (pcVar14 == (char *)0x0) {
      pcVar8 = "?DB? FILE";
    }
    fprintf((FILE *)this->out,"ERROR: missing %s argument. Usage:\n",pcVar8 + 5);
    out = this->out;
LAB_0020b456:
    showHelp(out,"import");
    return false;
  }
  local_48 = 0;
  pcVar10 = csv_read_one_field;
  if (this->mode == ASCII) {
    pcVar10 = ascii_read_one_field;
  }
  local_a0 = nArg - 1;
  local_bc = 1;
  uVar12 = 1;
  local_40 = 0;
  local_a4 = 0;
  local_b0 = (char *)0x0;
  pcVar8 = (char *)0x0;
  local_b8 = this;
  do {
    pcVar13 = azArg[uVar12];
    pcVar14 = pcVar8;
    pcVar2 = local_b0;
    if (*pcVar13 == '-') {
      if (pcVar13[1] == '-') {
        pcVar13 = pcVar13 + 1;
      }
      if ((pcVar13[1] == 'v') && (pcVar13[2] == '\0')) {
        local_a4 = local_a4 + 1;
      }
      else {
        iVar3 = strcmp(pcVar13,"-skip");
        if ((uVar12 < local_a0) && (iVar3 == 0)) {
          lVar6 = uVar12 + 1;
          uVar12 = uVar12 + 1;
          local_40 = integerValue(azArg[lVar6]);
          pcVar2 = local_b0;
        }
        else {
          iVar3 = strcmp(pcVar13,"-ascii");
          if (iVar3 == 0) {
            local_98.cColSep = 0x1f;
            local_98.cRowSep = 0x1e;
            local_bc = 0;
            local_48 = 0x1f;
            pcVar10 = ascii_read_one_field;
            pcVar2 = local_b0;
          }
          else {
            iVar3 = strcmp(pcVar13,"-csv");
            if (iVar3 != 0) {
              pFVar11 = (FILE *)local_b8->out;
              pcVar14 = "ERROR: unknown option: \"%s\".  Usage:\n";
              goto LAB_0020b73d;
            }
            local_98.cColSep = 0x2c;
            local_98.cRowSep = 10;
            local_bc = 0;
            local_48 = 0x2c;
            pcVar10 = csv_read_one_field;
            pcVar2 = local_b0;
          }
        }
      }
    }
    else {
      pcVar14 = pcVar13;
      if ((pcVar8 != (char *)0x0) && (pcVar14 = pcVar8, pcVar2 = pcVar13, local_b0 != (char *)0x0))
      {
        pFVar11 = (FILE *)local_b8->out;
        pcVar14 = "ERROR: extra argument: \"%s\".  Usage:\n";
LAB_0020b73d:
        pSVar1 = local_b8;
        fprintf(pFVar11,pcVar14,pcVar13);
        out = pSVar1->out;
        goto LAB_0020b456;
      }
    }
    local_b0 = pcVar2;
    pcVar13 = local_b0;
    pSVar1 = local_b8;
    uVar12 = uVar12 + 1;
    pcVar8 = pcVar14;
  } while (uVar12 < nArg);
  this = local_b8;
  if (local_b0 == (char *)0x0) goto LAB_0020b429;
  seenInterrupt = 0;
  OpenDB(local_b8,0);
  if (local_bc != 0) {
    iVar3 = (int)(pSVar1->colSeparator)._M_string_length;
    if (iVar3 == 0) {
      ImportData();
      return false;
    }
    if (1 < iVar3) {
      ImportData();
      return false;
    }
    iVar3 = (int)(pSVar1->rowSeparator)._M_string_length;
    if (iVar3 == 2) {
      if (pSVar1->mode != CSV) goto LAB_0020bb76;
      iVar3 = std::__cxx11::string::compare((char *)&pSVar1->rowSeparator);
      if (iVar3 != 0) goto LAB_0020bb76;
      std::__cxx11::string::operator=((string *)&pSVar1->rowSeparator,anon_var_dwarf_63f1717 + 8);
      iVar3 = (int)(pSVar1->rowSeparator)._M_string_length;
    }
    else if (iVar3 == 0) {
      ImportData();
      return false;
    }
    if (1 < iVar3) {
LAB_0020bb76:
      ImportData();
      return false;
    }
    local_98.cColSep = (int)*(pSVar1->colSeparator)._M_dataplus._M_p;
    local_48 = (ulong)(uint)local_98.cColSep;
    local_98.cRowSep = (int)*(pSVar1->rowSeparator)._M_dataplus._M_p;
  }
  local_98.nLine = 1;
  local_98.zFile = pcVar14;
  if (*pcVar14 == '|') {
    local_98.in = (FILE *)popen(pcVar14 + 1,"r");
    local_98.zFile = "<pipe>";
    local_98.xCloser = pclose;
  }
  else {
    local_98.in = (FILE *)fopen64(pcVar14,"rb");
    local_98.xCloser = fclose;
  }
  if ((FILE *)local_98.in == (FILE *)0x0) {
    pcVar8 = "Error: cannot open \"%s\"\n";
    goto LAB_0020bbfe;
  }
  if ((1 < local_a4) || (local_a4 == 1 && local_bc != 0)) {
    local_32[1] = 0;
    local_32[0] = (char)local_48;
    fwrite("Column separator ",0x11,1,(FILE *)pSVar1->out);
    OutputCString(pSVar1,local_32);
    fwrite(", row separator ",0x10,1,(FILE *)pSVar1->out);
    local_32[0] = (char)local_98.cRowSep;
    OutputCString(pSVar1,local_32);
    fputc(10,(FILE *)pSVar1->out);
  }
  if (0 < (int)local_40) {
    uVar12 = local_40;
LAB_0020b5f6:
    do {
      lVar6 = (*pcVar10)(&local_98);
      if (lVar6 != 0) {
        if (local_98.cTerm == local_98.cColSep) goto LAB_0020b5f6;
      }
      iVar3 = (int)uVar12;
      uVar12 = (ulong)(iVar3 - 1);
    } while (1 < iVar3);
  }
  pcVar14 = duckdb_shell_sqlite3_mprintf("SELECT * FROM %s",pcVar13);
  if (pcVar14 == (char *)0x0) {
    ImportData();
    goto LAB_0020bc4f;
  }
  sVar7 = strlen(pcVar14);
  pSVar1 = local_b8;
  iVar3 = duckdb_shell_sqlite3_prepare_v2(local_b8->db,pcVar14,-1,&local_c8,(char **)0x0);
  import_append_char(&local_98,0);
  if (iVar3 == 0) {
    duckdb_shell_sqlite3_free(pcVar14);
LAB_0020b6a0:
    uVar4 = duckdb_shell_sqlite3_column_count(local_c8);
    duckdb_shell_sqlite3_finalize(local_c8);
    local_c8 = (sqlite3_stmt *)0x0;
    if (uVar4 == 0) {
      return false;
    }
    pcVar14 = (char *)duckdb_shell_sqlite3_malloc64((long)(int)(((int)sVar7 + uVar4) * 2 + 0x14));
    if (pcVar14 == (char *)0x0) {
LAB_0020bc4f:
      if (((FILE *)local_98.in != (FILE *)0x0) && (local_98.xCloser != (_func_int_FILE_ptr *)0x0)) {
        (*local_98.xCloser)(local_98.in);
        local_98.in = (FILE *)0x0;
      }
      p = (ImportCtx *)local_98.z;
      duckdb_shell_sqlite3_free(local_98.z);
      local_98.z = (char *)0x0;
      shell_out_of_memory();
      iVar3 = p->cColSep;
      iVar5 = p->cRowSep;
      p->n = 0;
      c = fgetc((FILE *)p->in);
      if ((c == -1) || (seenInterrupt != 0)) {
        p->cTerm = -1;
      }
      else {
        bVar15 = c == iVar5;
        if (c != iVar3 && !bVar15) {
          do {
            import_append_char(p,c);
            c = fgetc((FILE *)p->in);
            bVar15 = c == iVar5;
            if ((c == -1) || (c == iVar3)) break;
          } while (c != iVar5);
        }
        if (bVar15) {
          p->nLine = p->nLine + 1;
        }
        p->cTerm = c;
        if (p->z != (char *)0x0) {
          p->z[p->n] = '\0';
          return (bool)(char)p->z;
        }
      }
      return false;
    }
    duckdb_shell_sqlite3_snprintf((int)sVar7 + 0x14,pcVar14,"INSERT INTO \"%w\" VALUES(?",pcVar13);
    sVar7 = strlen(pcVar14);
    pSVar1 = local_b8;
    if (1 < (int)uVar4) {
      sVar7 = (size_t)(int)sVar7;
      iVar3 = uVar4 - 1;
      do {
        (pcVar14 + sVar7)[0] = ',';
        (pcVar14 + sVar7)[1] = '?';
        sVar7 = sVar7 + 2;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    (pcVar14 + (int)sVar7)[0] = ')';
    (pcVar14 + (int)sVar7)[1] = '\0';
    local_b0 = (char *)(ulong)uVar4;
    if (1 < local_a4) {
      fprintf((FILE *)local_b8->out,"Insert using: %s\n",pcVar14);
    }
    iVar3 = duckdb_shell_sqlite3_prepare_v2(pSVar1->db,pcVar14,-1,&local_c8,(char **)0x0);
    duckdb_shell_sqlite3_free(pcVar14);
    if (iVar3 == 0) {
      iVar3 = duckdb_shell_sqlite3_get_autocommit(pSVar1->db);
      local_40 = CONCAT44(local_40._4_4_,iVar3);
      if (iVar3 != 0) {
        duckdb_shell_sqlite3_exec(pSVar1->db,"BEGIN",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0)
        ;
      }
      iVar3 = (int)local_b0;
      local_bc = iVar3 + 1;
      pcVar14 = local_b0;
      do {
        local_a0 = CONCAT44(local_a0._4_4_,local_98.nLine);
        uVar4 = 0;
        if (0 < (int)pcVar14) {
          uVar4 = 0;
          do {
            pcVar8 = (char *)(*pcVar10)(&local_98);
            if ((uVar4 == 0) && (pcVar8 == (char *)0x0)) goto LAB_0020ba56;
            if (local_b8->mode == ASCII) {
              if (pcVar8 == (char *)0x0) {
                if (uVar4 == 0) goto LAB_0020ba56;
              }
              else if ((uVar4 == 0) && (*pcVar8 == '\0')) {
LAB_0020ba56:
                uVar4 = 0;
                break;
              }
            }
            duckdb_shell_sqlite3_bind_text
                      (local_c8,uVar4 + 1,pcVar8,-1,(_func_void_void_ptr *)0xffffffffffffffff);
            if (((int)uVar4 < iVar3 + -1) && (local_98.cTerm != local_98.cColSep)) {
              fprintf(_stderr,
                      "%s:%d: expected %d columns but found %d - filling the rest with NULL\n",
                      local_98.zFile,local_a0 & 0xffffffff,local_b0,(ulong)(uVar4 + 1));
              iVar5 = uVar4 + 2;
              do {
                duckdb_shell_sqlite3_bind_null(local_c8,iVar5);
                bVar15 = iVar5 != iVar3;
                iVar5 = iVar5 + 1;
                uVar4 = local_bc;
              } while (bVar15);
            }
            uVar4 = uVar4 + 1;
            pcVar14 = local_b0;
          } while ((int)uVar4 < (int)local_b0);
        }
        if (local_98.cTerm == local_98.cColSep) {
          do {
            (*pcVar10)(&local_98);
            uVar4 = uVar4 + 1;
          } while (local_98.cTerm == local_98.cColSep);
          fprintf(_stderr,"%s:%d: expected %d columns but found %d - extras ignored\n",
                  local_98.zFile,local_a0 & 0xffffffff,(ulong)pcVar14 & 0xffffffff,(ulong)uVar4);
        }
        if ((int)pcVar14 <= (int)uVar4) {
          duckdb_shell_sqlite3_step(local_c8);
          iVar5 = duckdb_shell_sqlite3_reset(local_c8);
          if (iVar5 == 0) {
            local_98.nRow = local_98.nRow + 1;
          }
          else {
            ImportData();
          }
        }
        if (local_98.cTerm == 0xffffffff) {
          if (((FILE *)local_98.in != (FILE *)0x0) &&
             (local_98.xCloser != (_func_int_FILE_ptr *)0x0)) {
            (*local_98.xCloser)(local_98.in);
            local_98.in = (FILE *)0x0;
          }
          duckdb_shell_sqlite3_free(local_98.z);
          local_98.z = (char *)0x0;
          duckdb_shell_sqlite3_finalize(local_c8);
          pSVar1 = local_b8;
          if ((int)local_40 != 0) {
            duckdb_shell_sqlite3_exec
                      (local_b8->db,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
          }
          if (0 < local_a4) {
            fprintf((FILE *)pSVar1->out,"Added %d rows with %d errors using %d lines of input\n",
                    (ulong)local_98._40_8_ >> 0x20,local_98._48_8_ & 0xffffffff,
                    (ulong)(local_98.nLine - 1));
            return true;
          }
          return true;
        }
      } while( true );
    }
    pcVar14 = duckdb_shell_sqlite3_errmsg(pSVar1->db);
    PrintDatabaseError(pSVar1,pcVar14);
    if (local_c8 != (sqlite3_stmt *)0x0) {
      duckdb_shell_sqlite3_finalize(local_c8);
    }
    goto LAB_0020b874;
  }
  pcVar8 = duckdb_shell_sqlite3_errmsg(pSVar1->db);
  iVar3 = duckdb_shell_sqlite3_strglob("Catalog Error: Table with name *",pcVar8);
  if (iVar3 != 0) {
    duckdb_shell_sqlite3_free(pcVar14);
LAB_0020b84e:
    if (local_c8 != (sqlite3_stmt *)0x0) {
      duckdb_shell_sqlite3_finalize(local_c8);
    }
    pSVar1 = local_b8;
    pcVar14 = duckdb_shell_sqlite3_errmsg(local_b8->db);
    PrintDatabaseError(pSVar1,pcVar14);
LAB_0020b874:
    if (((FILE *)local_98.in != (FILE *)0x0) && (local_98.xCloser != (_func_int_FILE_ptr *)0x0)) {
      (*local_98.xCloser)(local_98.in);
      local_98.in = (FILE *)0x0;
    }
    duckdb_shell_sqlite3_free(local_98.z);
    return false;
  }
  pcVar8 = duckdb_shell_sqlite3_mprintf("CREATE TABLE %s",pcVar13);
  uVar12 = (*pcVar10)(&local_98);
  if (uVar12 != 0) {
    uVar9 = 0x28;
    local_a0 = uVar12;
    do {
      pcVar8 = duckdb_shell_sqlite3_mprintf("%z%c\n  \"%w\" TEXT",pcVar8,uVar9);
      if (local_98.cTerm != local_98.cColSep) goto LAB_0020b7c6;
      lVar6 = (*pcVar10)(&local_98);
      uVar9 = 0x2c;
    } while (lVar6 != 0);
    if (local_a0 != 0) {
LAB_0020b7c6:
      pcVar8 = duckdb_shell_sqlite3_mprintf("%z\n)",pcVar8);
      pSVar1 = local_b8;
      if (0 < local_a4) {
        fprintf((FILE *)local_b8->out,"%s\n",pcVar8);
      }
      iVar3 = duckdb_shell_sqlite3_exec
                        (pSVar1->db,pcVar8,(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
      duckdb_shell_sqlite3_free(pcVar8);
      pFVar11 = _stderr;
      if (iVar3 != 0) {
        pcVar14 = duckdb_shell_sqlite3_errmsg(pSVar1->db);
        fprintf(pFVar11,"CREATE TABLE %s(...) failed: %s\n",local_b0,pcVar14);
        goto LAB_0020b874;
      }
      iVar3 = duckdb_shell_sqlite3_prepare_v2(pSVar1->db,pcVar14,-1,&local_c8,(char **)0x0);
      duckdb_shell_sqlite3_free(pcVar14);
      pcVar13 = local_b0;
      if (iVar3 == 0) goto LAB_0020b6a0;
      goto LAB_0020b84e;
    }
  }
  duckdb_shell_sqlite3_free(pcVar8);
  if (((FILE *)local_98.in != (FILE *)0x0) && (local_98.xCloser != (_func_int_FILE_ptr *)0x0)) {
    (*local_98.xCloser)(local_98.in);
    local_98.in = (FILE *)0x0;
  }
  duckdb_shell_sqlite3_free(local_98.z);
  local_98.z = (char *)0x0;
  pcVar8 = "%s: empty file\n";
  pcVar14 = local_98.zFile;
LAB_0020bbfe:
  fprintf(_stderr,pcVar8,pcVar14);
  return false;
}

Assistant:

bool ShellState::ImportData(const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".import cannot be used in -safe mode\n");
		return false;
	}
	int rc;
	const char *zTable = nullptr;              /* Insert data into this table */
	const char *zFile = nullptr;               /* Name of file to extra content from */
	sqlite3_stmt *pStmt = nullptr;             /* A statement */
	int nCol;                                  /* Number of columns in the table */
	int nByte;                                 /* Number of bytes in an SQL string */
	int j;                                     /* Loop counters */
	int needCommit;                            /* True to COMMIT or ROLLBACK at end */
	char *zSql;                                /* An SQL statement */
	ImportCtx sCtx;                            /* Reader context */
	char *(SQLITE_CDECL * xRead)(ImportCtx *); /* Func to read one value */
	int eVerbose = 0;                          /* Larger for more console output */
	int nSkip = 0;                             /* Initial lines to skip */
	int useOutputMode = 1;                     /* Use output mode to determine separators */

	memset(&sCtx, 0, sizeof(sCtx));
	if (mode == RenderMode::ASCII) {
		xRead = ascii_read_one_field;
	} else {
		xRead = csv_read_one_field;
	}
	for (idx_t i = 1; i < nArg; i++) {
		auto z = azArg[i];
		if (z[0] == '-' && z[1] == '-')
			z++;
		if (z[0] != '-') {
			if (zFile == 0) {
				zFile = z;
			} else if (zTable == 0) {
				zTable = z;
			} else {
				utf8_printf(out, "ERROR: extra argument: \"%s\".  Usage:\n", z);
				showHelp(out, "import");
				return false;
			}
		} else if (strcmp(z, "-v") == 0) {
			eVerbose++;
		} else if (strcmp(z, "-skip") == 0 && i < nArg - 1) {
			nSkip = (int)integerValue(azArg[++i]);
		} else if (strcmp(z, "-ascii") == 0) {
			sCtx.cColSep = SEP_Unit[0];
			sCtx.cRowSep = SEP_Record[0];
			xRead = ascii_read_one_field;
			useOutputMode = 0;
		} else if (strcmp(z, "-csv") == 0) {
			sCtx.cColSep = ',';
			sCtx.cRowSep = '\n';
			xRead = csv_read_one_field;
			useOutputMode = 0;
		} else {
			utf8_printf(out, "ERROR: unknown option: \"%s\".  Usage:\n", z);
			showHelp(out, "import");
			return false;
		}
	}
	if (zTable == 0) {
		utf8_printf(out, "ERROR: missing %s argument. Usage:\n", zFile == 0 ? "FILE" : "TABLE");
		showHelp(out, "import");
		return false;
	}
	seenInterrupt = 0;
	OpenDB(0);
	if (useOutputMode) {
		/* If neither the --csv or --ascii options are specified, then set
		** the column and row separator characters from the output mode. */
		int nSep = colSeparator.size();
		if (nSep == 0) {
			raw_printf(stderr, "Error: non-null column separator required for import\n");
			return false;
		}
		if (nSep > 1) {
			raw_printf(stderr, "Error: multi-character column separators not allowed"
			                   " for import\n");
			return false;
		}
		nSep = rowSeparator.size();
		if (nSep == 0) {
			raw_printf(stderr, "Error: non-null row separator required for import\n");
			return false;
		}
		if (nSep == 2 && mode == RenderMode::CSV && rowSeparator == SEP_CrLf) {
			/* When importing CSV (only), if the row separator is set to the
			** default output row separator, change it to the default input
			** row separator.  This avoids having to maintain different input
			** and output row separators. */
			rowSeparator = SEP_Row;
			nSep = rowSeparator.size();
		}
		if (nSep > 1) {
			raw_printf(stderr, "Error: multi-character row separators not allowed"
			                   " for import\n");
			return false;
		}
		sCtx.cColSep = colSeparator[0];
		sCtx.cRowSep = rowSeparator[0];
	}
	sCtx.zFile = zFile;
	sCtx.nLine = 1;
	if (sCtx.zFile[0] == '|') {
#ifdef SQLITE_OMIT_POPEN
		raw_printf(stderr, "Error: pipes are not supported in this OS\n");
		rc = 1;
		goto meta_command_exit;
#else
		sCtx.in = popen(sCtx.zFile + 1, "r");
		sCtx.zFile = "<pipe>";
		sCtx.xCloser = pclose;
#endif
	} else {
		sCtx.in = fopen(sCtx.zFile, "rb");
		sCtx.xCloser = fclose;
	}
	if (sCtx.in == 0) {
		utf8_printf(stderr, "Error: cannot open \"%s\"\n", zFile);
		return false;
	}
	if (eVerbose >= 2 || (eVerbose >= 1 && useOutputMode)) {
		char zSep[2];
		zSep[1] = 0;
		zSep[0] = sCtx.cColSep;
		utf8_printf(out, "Column separator ");
		OutputCString(zSep);
		utf8_printf(out, ", row separator ");
		zSep[0] = sCtx.cRowSep;
		OutputCString(zSep);
		utf8_printf(out, "\n");
	}
	while ((nSkip--) > 0) {
		while (xRead(&sCtx) && sCtx.cTerm == sCtx.cColSep) {
		}
	}
	zSql = sqlite3_mprintf("SELECT * FROM %s", zTable);
	if (zSql == 0) {
		import_cleanup(&sCtx);
		shell_out_of_memory();
	}
	nByte = StringLength(zSql);
	rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	import_append_char(&sCtx, 0); /* To ensure sCtx.z is allocated */
	if (rc && sqlite3_strglob("Catalog Error: Table with name *", sqlite3_errmsg(db)) == 0) {
		char *zCreate = sqlite3_mprintf("CREATE TABLE %s", zTable);
		char cSep = '(';
		while (xRead(&sCtx)) {
			zCreate = sqlite3_mprintf("%z%c\n  \"%w\" TEXT", zCreate, cSep, sCtx.z);
			cSep = ',';
			if (sCtx.cTerm != sCtx.cColSep)
				break;
		}
		if (cSep == '(') {
			sqlite3_free(zCreate);
			import_cleanup(&sCtx);
			utf8_printf(stderr, "%s: empty file\n", sCtx.zFile);
			return false;
		}
		zCreate = sqlite3_mprintf("%z\n)", zCreate);
		if (eVerbose >= 1) {
			utf8_printf(out, "%s\n", zCreate);
		}
		rc = sqlite3_exec(db, zCreate, 0, 0, 0);
		sqlite3_free(zCreate);
		if (rc) {
			utf8_printf(stderr, "CREATE TABLE %s(...) failed: %s\n", zTable, sqlite3_errmsg(db));
			import_cleanup(&sCtx);
			return false;
		}
		rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	}
	sqlite3_free(zSql);
	if (rc) {
		if (pStmt)
			sqlite3_finalize(pStmt);
		ShellDatabaseError(db);
		import_cleanup(&sCtx);
		return false;
	}
	nCol = sqlite3_column_count(pStmt);
	sqlite3_finalize(pStmt);
	pStmt = 0;
	if (nCol == 0)
		return 0; /* no columns, no error */
	zSql = (char *)sqlite3_malloc64(nByte * 2 + 20 + nCol * 2);
	if (zSql == 0) {
		import_cleanup(&sCtx);
		shell_out_of_memory();
	}
	sqlite3_snprintf(nByte + 20, zSql, "INSERT INTO \"%w\" VALUES(?", zTable);
	j = StringLength(zSql);
	for (int i = 1; i < nCol; i++) {
		zSql[j++] = ',';
		zSql[j++] = '?';
	}
	zSql[j++] = ')';
	zSql[j] = 0;
	if (eVerbose >= 2) {
		utf8_printf(out, "Insert using: %s\n", zSql);
	}
	rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	sqlite3_free(zSql);
	if (rc) {
		ShellDatabaseError(db);
		if (pStmt)
			sqlite3_finalize(pStmt);
		import_cleanup(&sCtx);
		return false;
	}
	needCommit = sqlite3_get_autocommit(db);
	if (needCommit)
		sqlite3_exec(db, "BEGIN", 0, 0, 0);
	do {
		int startLine = sCtx.nLine;
		int i;
		for (i = 0; i < nCol; i++) {
			char *z = xRead(&sCtx);
			/*
			** Did we reach end-of-file before finding any columns?
			** If so, stop instead of NULL filling the remaining columns.
			*/
			if (z == 0 && i == 0)
				break;
			/*
			** Did we reach end-of-file OR end-of-line before finding any
			** columns in ASCII mode?  If so, stop instead of NULL filling
			** the remaining columns.
			*/
			if (mode == RenderMode::ASCII && (z == 0 || z[0] == 0) && i == 0)
				break;
			sqlite3_bind_text(pStmt, i + 1, z, -1, SQLITE_TRANSIENT);
			if (i < nCol - 1 && sCtx.cTerm != sCtx.cColSep) {
				utf8_printf(stderr,
				            "%s:%d: expected %d columns but found %d - "
				            "filling the rest with NULL\n",
				            sCtx.zFile, startLine, nCol, i + 1);
				i += 2;
				while (i <= nCol) {
					sqlite3_bind_null(pStmt, i);
					i++;
				}
			}
		}
		if (sCtx.cTerm == sCtx.cColSep) {
			do {
				xRead(&sCtx);
				i++;
			} while (sCtx.cTerm == sCtx.cColSep);
			utf8_printf(stderr,
			            "%s:%d: expected %d columns but found %d - "
			            "extras ignored\n",
			            sCtx.zFile, startLine, nCol, i);
		}
		if (i >= nCol) {
			sqlite3_step(pStmt);
			rc = sqlite3_reset(pStmt);
			if (rc != SQLITE_OK) {
				utf8_printf(stderr, "%s:%d: INSERT failed: %s\n", sCtx.zFile, startLine, sqlite3_errmsg(db));
				sCtx.nErr++;
			} else {
				sCtx.nRow++;
			}
		}
	} while (sCtx.cTerm != EOF);

	import_cleanup(&sCtx);
	sqlite3_finalize(pStmt);
	if (needCommit)
		sqlite3_exec(db, "COMMIT", 0, 0, 0);
	if (eVerbose > 0) {
		utf8_printf(out, "Added %d rows with %d errors using %d lines of input\n", sCtx.nRow, sCtx.nErr,
		            sCtx.nLine - 1);
	}
	return true;
}